

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O0

void __thiscall irr::COSOperator::COSOperator(COSOperator *this,stringc *osVersion)

{
  string<char> *in_RSI;
  IOSOperator *in_RDI;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[1].field_0x18);
  IOSOperator::IOSOperator(in_RDI,&PTR_construction_vtable_24__00443f70);
  in_RDI->_vptr_IOSOperator = (_func_int **)0x443f00;
  *(undefined8 *)&in_RDI[1].field_0x18 = 0x443f58;
  core::string<char>::string(in_RSI,(string<char> *)in_RDI);
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  *(undefined8 *)&in_RDI[1].field_0x10 = 0;
  return;
}

Assistant:

COSOperator::COSOperator(const core::stringc &osVersion) :
		OperatingSystem(osVersion)
{
#ifdef _DEBUG
	setDebugName("COSOperator");
#endif
}